

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O3

char * __thiscall
MeCab::anon_unknown_0::LatticeImpl::enumNBestAsStringInternal
          (LatticeImpl *this,size_t N,StringBuffer *os)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ssize_t sVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _func_int **pp_Var5;
  StringBuffer *in_RCX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *__buf;
  void *extraout_RDX_02;
  char *pcVar6;
  Node local_98;
  
  os->size_ = 0;
  if (N - 0x201 < 0xfffffffffffffe00) {
    pp_Var5 = (this->super_Lattice)._vptr_Lattice;
    pcVar6 = "nbest size must be 1 <= nbest <= 512";
  }
  else {
    do {
      iVar2 = (*(this->super_Lattice)._vptr_Lattice[0x10])(this);
      __buf = extraout_RDX;
      if ((char)iVar2 == '\0') break;
      if (this->writer_ == (Writer *)0x0) {
        anon_unknown_3::writeLattice(&this->super_Lattice,os);
        __buf = extraout_RDX_01;
      }
      else {
        sVar4 = Writer::write(this->writer_,(int)this,os,(size_t)in_RCX);
        __buf = extraout_RDX_00;
        if ((char)sVar4 == '\0') {
          return (char *)0x0;
        }
      }
      N = N - 1;
    } while (N != 0);
    if (this->writer_ != (Writer *)0x0) {
      local_98.id = 0;
      local_98.length = 0;
      local_98.rlength = 0;
      local_98.wcost = 0;
      local_98._98_6_ = 0;
      local_98.cost = 0;
      local_98.isbest = '\0';
      local_98._81_3_ = 0;
      local_98.alpha = 0.0;
      local_98.beta = 0.0;
      local_98.prob = 0.0;
      local_98.surface = (char *)0x0;
      local_98.feature = (char *)0x0;
      local_98.rpath = (mecab_path_t *)0x0;
      local_98.lpath = (mecab_path_t *)0x0;
      local_98.enext = (mecab_node_t *)0x0;
      local_98.bnext = (mecab_node_t *)0x0;
      local_98.prev = (mecab_node_t *)0x0;
      local_98.next = (mecab_node_t *)0x0;
      local_98.rcAttr = 0;
      local_98.lcAttr = 0;
      local_98.posid = 0;
      local_98.char_type = '\0';
      local_98.stat = '\x04';
      iVar2 = (*(this->super_Lattice)._vptr_Lattice[8])(this);
      iVar3 = (*(this->super_Lattice)._vptr_Lattice[0xb])(this);
      local_98.surface = (char *)(CONCAT44(extraout_var_00,iVar3) + CONCAT44(extraout_var,iVar2));
      in_RCX = os;
      bVar1 = Writer::writeNode(this->writer_,&this->super_Lattice,&local_98,os);
      __buf = extraout_RDX_02;
      if (!bVar1) {
        return (char *)0x0;
      }
    }
    StringBuffer::write(os,0,__buf,(size_t)in_RCX);
    if ((os->ptr_ == (char *)0x0 | os->error_) != 1) {
      return os->ptr_;
    }
    pp_Var5 = (this->super_Lattice)._vptr_Lattice;
    pcVar6 = "output buffer overflow";
  }
  (*pp_Var5[0x25])(this,pcVar6);
  return (char *)0x0;
}

Assistant:

const char *LatticeImpl::enumNBestAsStringInternal(size_t N,
                                                   StringBuffer *os) {
  os->clear();

  if (N == 0 || N > NBEST_MAX) {
    set_what("nbest size must be 1 <= nbest <= 512");
    return 0;
  }

  for (size_t i = 0; i < N; ++i) {
    if (!next()) {
      break;
    }
    if (writer_) {
      if (!writer_->write(this, os)) {
        return 0;
      }
    } else {
      writeLattice(this, os);
    }
  }

  // make a dummy node for EON
  if (writer_) {
    Node eon_node;
    memset(&eon_node, 0, sizeof(eon_node));
    eon_node.stat = MECAB_EON_NODE;
    eon_node.next = 0;
    eon_node.surface = this->sentence() + this->size();
    if (!writer_->writeNode(this, &eon_node, os)) {
      return 0;
    }
  }
  *os << '\0';

  if (!os->str()) {
    set_what("output buffer overflow");
    return 0;
  }

  return os->str();
}